

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O1

void __thiscall vectorgraphics::TikzPlotter::cleanup(TikzPlotter *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string_type local_a0;
  path local_80;
  path local_58;
  
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,*(long *)ctx,*(long *)(ctx + 8) + *(long *)ctx);
  std::__cxx11::string::append((char *)&local_a0);
  std::filesystem::__cxx11::path::path(&local_80,&local_a0,auto_format);
  std::filesystem::__cxx11::operator/(&local_58,(path *)this,&local_80);
  std::filesystem::remove(&local_58);
  std::filesystem::__cxx11::path::~path(&local_58);
  std::filesystem::__cxx11::path::~path(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,*(long *)ctx,*(long *)(ctx + 8) + *(long *)ctx);
  std::__cxx11::string::append((char *)&local_a0);
  std::filesystem::__cxx11::path::path(&local_80,&local_a0,auto_format);
  std::filesystem::__cxx11::operator/(&local_58,(path *)this,&local_80);
  std::filesystem::remove(&local_58);
  std::filesystem::__cxx11::path::~path(&local_58);
  std::filesystem::__cxx11::path::~path(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,*(long *)ctx,*(long *)(ctx + 8) + *(long *)ctx);
  std::__cxx11::string::append((char *)&local_a0);
  std::filesystem::__cxx11::path::path(&local_80,&local_a0,auto_format);
  std::filesystem::__cxx11::operator/(&local_58,(path *)this,&local_80);
  std::filesystem::remove(&local_58);
  std::filesystem::__cxx11::path::~path(&local_58);
  std::filesystem::__cxx11::path::~path(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

bool TikzPlotter::cleanup(std::filesystem::path path, std::string name) {
    bool success = true;
    success &= std::filesystem::remove(path / (name + ".aux"));
    success &= std::filesystem::remove(path / (name + ".log"));
    success &= std::filesystem::remove(path / (name + ".sta"));
    return success;
  }